

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O2

int run_test_semaphore_2(void)

{
  uv_sem_t *puVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  int64_t eval_b;
  uv_thread_t thread;
  int64_t eval_b_2;
  worker_config_conflict1 wc;
  
  puVar1 = &wc.sem;
  wc.sem._24_8_ = 0;
  wc.sem._8_8_ = 0;
  wc.sem._16_8_ = 0;
  wc.mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  wc.sem.__align = 0;
  wc.mutex._16_8_ = 0;
  wc.mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  wc.mutex.__align = 0;
  wc.mutex._8_8_ = 0;
  wc.delay = 100;
  wc.posted = 0;
  iVar2 = uv_sem_init(puVar1,0);
  eval_b = (int64_t)iVar2;
  thread = eval_b;
  if (eval_b == 0) {
    iVar2 = uv_mutex_init(&wc);
    eval_b = (int64_t)iVar2;
    thread = eval_b;
    if (eval_b == 0) {
      iVar2 = uv_thread_create(&thread,worker,&wc);
      eval_b = (int64_t)iVar2;
      eval_b_2 = 0;
      if (eval_b == 0) {
        uv_sem_wait(puVar1);
        iVar2 = uv_thread_join(&thread);
        eval_b = (int64_t)iVar2;
        eval_b_2 = 0;
        if (eval_b == 0) {
          uv_mutex_destroy(&wc);
          uv_sem_destroy(puVar1);
          return 0;
        }
        pcVar3 = "uv_thread_join(&thread)";
        uVar4 = 0x57;
      }
      else {
        pcVar3 = "uv_thread_create(&thread, worker, &wc)";
        uVar4 = 0x53;
      }
      eval_b_2 = 0;
    }
    else {
      pcVar3 = "uv_mutex_init(&wc.mutex)";
      uVar4 = 0x52;
    }
  }
  else {
    pcVar3 = "uv_sem_init(&wc.sem, 0)";
    uVar4 = 0x51;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
          ,uVar4,pcVar3,"==","0",eval_b,"==",0);
  abort();
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT_OK(uv_sem_init(&wc.sem, 0));
  ASSERT_OK(uv_mutex_init(&wc.mutex));
  ASSERT_OK(uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT_OK(uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}